

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<8>::
BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  MutexSys *pMVar12;
  anon_union_16_2_9473010e_for_vuint_impl<4>_1 aVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  float *pfVar22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 in_ZMM0 [64];
  vuint<4> vgeomID;
  Lock<embree::MutexSys> local_e8;
  undefined1 auStack_d8 [16];
  undefined1 auStack_c8 [16];
  Lock<embree::MutexSys> local_b8;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_> *local_88;
  range<unsigned_long> *local_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  vuint<4> vprimID;
  
  auVar25 = in_ZMM0._0_16_;
  uVar18 = set->_begin;
  uVar15 = (set->_end - uVar18) + 3 >> 2;
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  vgeomID.field_0.v[0] = uVar15 * 0xb0;
  this_01 = pTVar7->parent;
  local_88 = this;
  local_80 = set;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_b8.locked = true;
    local_b8.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_e8.locked = true;
    auVar25 = (undefined1  [16])0x0;
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_78);
    Lock<embree::MutexSys>::~Lock(&local_e8);
    Lock<embree::MutexSys>::~Lock(&local_b8);
  }
  uVar14 = vgeomID.field_0.v[0];
  pTVar7->bytesUsed = pTVar7->bytesUsed + vgeomID.field_0.v[0];
  sVar19 = pTVar7->cur;
  uVar20 = (ulong)(-(int)sVar19 & 0xf);
  uVar16 = sVar19 + vgeomID.field_0.v[0] + uVar20;
  pTVar7->cur = uVar16;
  if (pTVar7->end < uVar16) {
    pTVar7->cur = sVar19;
    pMVar12 = (MutexSys *)pTVar7->allocBlockSize;
    if ((MutexSys *)(vgeomID.field_0.v[0] * 4) < pMVar12 ||
        (long)(vgeomID.field_0.v[0] * 4) - (long)pMVar12 == 0) {
      local_e8.mutex = pMVar12;
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar7->ptr = pcVar17;
      sVar19 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar19;
      pTVar7->end = (size_t)local_e8.mutex;
      pTVar7->cur = uVar14;
      if (local_e8.mutex < (ulong)uVar14) {
        pTVar7->cur = 0;
        local_e8.mutex = (MutexSys *)pTVar7->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar7->ptr = pcVar17;
        sVar19 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar19;
        pTVar7->end = (size_t)local_e8.mutex;
        pTVar7->cur = uVar14;
        if (local_e8.mutex < (ulong)uVar14) {
          pTVar7->cur = 0;
          pcVar17 = (char *)0x0;
          goto LAB_00c47fd8;
        }
      }
      pTVar7->bytesWasted = sVar19;
    }
    else {
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar20;
    pcVar17 = pTVar7->ptr + (uVar16 - vgeomID.field_0._0_8_);
  }
LAB_00c47fd8:
  uVar16 = 0;
  aVar13 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar25,auVar25);
  local_e8.mutex = (MutexSys *)0x0;
  pMVar12 = local_e8.mutex;
  for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
    uVar20 = local_80->_end;
    pSVar8 = ((local_88->createLeafFunc).bvh)->scene;
    auStack_c8 = (undefined1  [16])0x0;
    local_e8.locked = false;
    local_e8._9_7_ = 0;
    auStack_d8 = (undefined1  [16])0x0;
    auStack_98 = (undefined1  [16])0x0;
    auStack_a8 = (undefined1  [16])0x0;
    auStack_58 = (undefined1  [16])0x0;
    uStack_70 = 0;
    auStack_68 = (undefined1  [16])0x0;
    pfVar22 = prims[uVar18].upper.field_0.m128 + 3;
    vgeomID.field_0 = aVar13;
    local_e8.mutex = pMVar12;
    local_b8.mutex = pMVar12;
    local_b8.locked = local_e8.locked;
    local_b8._9_7_ = local_e8._9_7_;
    local_78 = (ThreadLocal2 *)pMVar12;
    vprimID.field_0 = aVar13;
    for (uVar23 = 0; (uVar23 < 4 && (uVar18 + uVar23 < uVar20)); uVar23 = uVar23 + 1) {
      fVar4 = pfVar22[-4];
      fVar5 = *pfVar22;
      pGVar9 = (pSVar8->geometries).items[(uint)fVar4].ptr;
      lVar24 = (ulong)(uint)fVar5 *
               pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = *(long *)&pGVar9->field_0x58;
      lVar10 = *(long *)&pGVar9[1].time_range.upper;
      p_Var11 = pGVar9[1].intersectionFilterN;
      auVar25 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(lVar21 + lVar24) * (long)p_Var11);
      auVar2 = *(undefined1 (*) [16])
                (lVar10 + (ulong)*(uint *)(lVar21 + 4 + lVar24) * (long)p_Var11);
      auVar3 = *(undefined1 (*) [16])
                (lVar10 + (ulong)*(uint *)(lVar21 + 8 + lVar24) * (long)p_Var11);
      *(int *)((long)&local_e8.mutex + uVar23 * 4) = auVar25._0_4_;
      uVar6 = vextractps_avx(auVar25,1);
      *(undefined4 *)(auStack_d8 + uVar23 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar25,2);
      *(undefined4 *)(auStack_c8 + uVar23 * 4) = uVar6;
      *(int *)((long)&local_b8.mutex + uVar23 * 4) = auVar2._0_4_;
      uVar6 = vextractps_avx(auVar2,1);
      *(undefined4 *)(auStack_a8 + uVar23 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar2,2);
      *(undefined4 *)(auStack_98 + uVar23 * 4) = uVar6;
      *(int *)((long)&local_78 + uVar23 * 4) = auVar3._0_4_;
      uVar6 = vextractps_avx(auVar3,1);
      *(undefined4 *)(auStack_68 + uVar23 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar3,2);
      *(undefined4 *)(auStack_58 + uVar23 * 4) = uVar6;
      vgeomID.field_0.i[uVar23] = (uint)fVar4;
      vprimID.field_0.i[uVar23] = (uint)fVar5;
      pfVar22 = pfVar22 + 8;
    }
    lVar21 = uVar16 * 0xb0;
    auVar25[8] = local_e8.locked;
    auVar25._0_8_ = local_e8.mutex;
    auVar25._9_7_ = local_e8._9_7_;
    auVar2[8] = local_b8.locked;
    auVar2._0_8_ = local_b8.mutex;
    auVar2._9_7_ = local_b8._9_7_;
    auVar3._8_8_ = uStack_70;
    auVar3._0_8_ = local_78;
    auVar25 = vmovntps_avx(auVar25);
    *(undefined1 (*) [16])(pcVar17 + lVar21) = auVar25;
    auVar25 = vmovntps_avx(auStack_d8);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x10) = auVar25;
    auVar25 = vmovntps_avx(auStack_c8);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x20) = auVar25;
    auVar25 = vmovntps_avx(auVar2);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x30) = auVar25;
    auVar25 = vmovntps_avx(auStack_a8);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x40) = auVar25;
    auVar25 = vmovntps_avx(auStack_98);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x50) = auVar25;
    auVar25 = vmovntps_avx(auVar3);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x60) = auVar25;
    auVar25 = vmovntps_avx(auStack_68);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x70) = auVar25;
    auVar25 = vmovntps_avx(auStack_58);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x80) = auVar25;
    auVar25 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0x90) = auVar25;
    auVar25 = vmovntps_avx((undefined1  [16])vprimID.field_0);
    *(undefined1 (*) [16])(pcVar17 + lVar21 + 0xa0) = auVar25;
    uVar18 = uVar18 + uVar23;
  }
  uVar18 = 7;
  if (uVar15 < 7) {
    uVar18 = uVar15;
  }
  return (NodeRef)(uVar18 | (ulong)pcVar17 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }